

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servlk.cpp
# Opt level: O0

UBool __thiscall icu_63::LocaleKey::isFallbackOf(LocaleKey *this,UnicodeString *id)

{
  char16_t cVar1;
  int32_t iVar2;
  int32_t iVar3;
  bool local_89;
  bool local_7d;
  undefined1 local_58 [8];
  UnicodeString temp;
  UnicodeString *id_local;
  LocaleKey *this_local;
  
  temp.fUnion._48_8_ = id;
  icu_63::UnicodeString::UnicodeString((UnicodeString *)local_58,id);
  ICUServiceKey::parseSuffix((UnicodeString *)local_58);
  iVar2 = icu_63::UnicodeString::indexOf((UnicodeString *)local_58,&this->_primaryID);
  local_7d = false;
  if (iVar2 == 0) {
    iVar2 = icu_63::UnicodeString::length((UnicodeString *)local_58);
    iVar3 = icu_63::UnicodeString::length(&this->_primaryID);
    local_89 = true;
    if (iVar2 != iVar3) {
      iVar2 = icu_63::UnicodeString::length(&this->_primaryID);
      cVar1 = icu_63::UnicodeString::charAt((UnicodeString *)local_58,iVar2);
      local_89 = cVar1 == L'_';
    }
    local_7d = local_89;
  }
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_58);
  return local_7d;
}

Assistant:

UBool
LocaleKey::isFallbackOf(const UnicodeString& id) const {
    UnicodeString temp(id);
    parseSuffix(temp);
    return temp.indexOf(_primaryID) == 0 &&
        (temp.length() == _primaryID.length() ||
        temp.charAt(_primaryID.length()) == UNDERSCORE_CHAR);
}